

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

InstanceBuilder * __thiscall
vkb::InstanceBuilder::enable_layer(InstanceBuilder *this,char *layer_name)

{
  char *local_10;
  
  if (layer_name != (char *)0x0) {
    local_10 = layer_name;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&(this->info).layers,&local_10);
  }
  return this;
}

Assistant:

InstanceBuilder& InstanceBuilder::enable_layer(const char* layer_name) {
    if (!layer_name) return *this;
    info.layers.push_back(layer_name);
    return *this;
}